

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool.cxx
# Opt level: O3

bool __thiscall
cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *rpaths)

{
  string *psVar1;
  pointer pcVar2;
  cmRuntimeDependencyArchive *this_00;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  cmUVProcessChainBuilder *this_01;
  Status *pSVar7;
  uv_loop_t *loop;
  istream *piVar8;
  _Alloc_hider _Var9;
  cmUVProcessChain process;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  ostringstream e;
  cmUVProcessChainBuilder builder;
  RegularExpressionMatch pathMatch;
  cmUVPipeIStream output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  undefined1 local_690 [8];
  StdioConfiguration local_688;
  StdioConfiguration local_680;
  undefined1 local_678;
  undefined7 uStack_677;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_650;
  undefined1 local_640 [112];
  ios_base local_5d0 [408];
  cmUVProcessChainBuilder local_438;
  undefined1 local_3d8 [264];
  char *local_2d0;
  undefined1 local_1d0 [136];
  uv_handle_ptr_base_<uv_pipe_s> local_148;
  undefined8 local_138 [33];
  
  local_668.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_668.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_668.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool).Archive;
  pcVar2 = local_640 + 0x10;
  local_650._M_allocated_capacity = (size_type)libs;
  local_650._8_8_ = rpaths;
  local_640._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"otool","");
  bVar3 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)local_640,&local_668);
  if ((pointer)local_640._0_8_ != pcVar2) {
    operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
  }
  if (!bVar3) {
    local_640._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"Could not find otool","");
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_640);
    if ((pointer)local_640._0_8_ != pcVar2) {
      operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
    }
    bVar3 = false;
    goto LAB_0055a200;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_668,
             (char (*) [3])0x7d4aa3);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_668,file);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_438);
  this_01 = cmUVProcessChainBuilder::SetBuiltinStream(&local_438,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand(this_01,&local_668);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_690);
  bVar3 = cmUVProcessChain::Valid((cmUVProcessChain *)local_690);
  if ((bVar3) &&
     (pSVar7 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_690,0),
     pSVar7->SpawnResult == 0)) {
    local_688 = (StdioConfiguration)((long)local_690 + 0x18);
    local_680.Type = None;
    local_680.FileDescriptor = 0;
    local_678 = 0;
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::rpathRegex == '\0') &&
       (iVar6 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::rpathRegex), iVar6 != 0)) {
      GetFileInfo::rpathRegex.regmust = (char *)0x0;
      GetFileInfo::rpathRegex.program = (char *)0x0;
      GetFileInfo::rpathRegex.progsize = 0;
      memset(&GetFileInfo::rpathRegex,0,0x20a);
      cmsys::RegularExpression::compile(&GetFileInfo::rpathRegex,"^ *cmd LC_RPATH$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::rpathRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::rpathRegex);
    }
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::loadDylibRegex == '\0') &&
       (iVar6 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::loadDylibRegex), iVar6 != 0)) {
      GetFileInfo::loadDylibRegex.regmust = (char *)0x0;
      GetFileInfo::loadDylibRegex.program = (char *)0x0;
      GetFileInfo::loadDylibRegex.progsize = 0;
      memset(&GetFileInfo::loadDylibRegex,0,0x20a);
      cmsys::RegularExpression::compile
                (&GetFileInfo::loadDylibRegex,"^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::loadDylibRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::loadDylibRegex);
    }
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::pathRegex == '\0') &&
       (iVar6 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::pathRegex), iVar6 != 0)) {
      GetFileInfo::pathRegex.regmust = (char *)0x0;
      GetFileInfo::pathRegex.program = (char *)0x0;
      GetFileInfo::pathRegex.progsize = 0;
      memset(&GetFileInfo::pathRegex,0,0x20a);
      cmsys::RegularExpression::compile(&GetFileInfo::pathRegex,"^ *path (.*) \\(offset [0-9]+\\)$")
      ;
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::pathRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::pathRegex);
    }
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::nameRegex == '\0') &&
       (iVar6 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::nameRegex), iVar6 != 0)) {
      GetFileInfo::nameRegex.regmust = (char *)0x0;
      GetFileInfo::nameRegex.program = (char *)0x0;
      GetFileInfo::nameRegex.progsize = 0;
      memset(&GetFileInfo::nameRegex,0,0x20a);
      cmsys::RegularExpression::compile(&GetFileInfo::nameRegex,"^ *name (.*) \\(offset [0-9]+\\)$")
      ;
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::nameRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::nameRegex);
    }
    loop = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_690);
    iVar6 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_690);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
              ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)local_1d0,loop,iVar6);
    psVar1 = (string *)(local_690 + 8);
LAB_0055a2a8:
    cVar5 = (char)(istream *)local_1d0;
    cVar4 = std::ios::widen((char)*(_func_int **)(local_1d0._0_8_ + -0x18) + cVar5);
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1d0,psVar1,cVar4);
    if (((&piVar8->field_0x20)[(long)piVar8->_vptr_basic_istream[-3]] & 5) == 0) {
      memset((RegularExpressionMatch *)local_640,0,0x208);
      bVar3 = cmsys::RegularExpression::find
                        (&GetFileInfo::rpathRegex,(char *)local_688,
                         (RegularExpressionMatch *)local_640);
      if (!bVar3) goto LAB_0055a3e3;
      cVar4 = std::ios::widen((char)*(_func_int **)(local_1d0._0_8_ + -0x18) + cVar5);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1d0,psVar1,cVar4);
      if (((&piVar8->field_0x20)[(long)piVar8->_vptr_basic_istream[-3]] & 5) != 0) {
LAB_0055a5c6:
        local_3d8._0_8_ = local_3d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3d8,"Invalid output from otool","");
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_3d8);
        goto LAB_0055a6d3;
      }
      cVar5 = std::ios::widen((char)*(_func_int **)(local_1d0._0_8_ + -0x18) + cVar5);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1d0,psVar1,cVar5);
      if (((&piVar8->field_0x20)[(long)piVar8->_vptr_basic_istream[-3]] & 5) != 0)
      goto LAB_0055a5c6;
      memset((RegularExpressionMatch *)local_3d8,0,0x208);
      bVar3 = cmsys::RegularExpression::find
                        (&GetFileInfo::pathRegex,(char *)local_688,
                         (RegularExpressionMatch *)local_3d8);
      if (!bVar3) {
        local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6b0,"Invalid output from otool","");
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_6b0);
        goto LAB_0055a74a;
      }
      if ((char *)local_3d8._8_8_ == (char *)0x0) {
        local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
        local_6b0._M_string_length = 0;
        local_6b0.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6b0,local_3d8._8_8_,local_2d0);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_650._8_8_,&local_6b0);
      goto LAB_0055a51b;
    }
    bVar3 = cmUVProcessChain::Wait((cmUVProcessChain *)local_690,0);
    if (bVar3) {
      pSVar7 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_690,0);
      if (pSVar7->ExitStatus != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_640);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_640,"Failed to run otool on:\n  ",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_640,(file->_M_dataplus)._M_p,file->_M_string_length);
        std::__cxx11::stringbuf::str();
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_3d8);
        goto LAB_0055a658;
      }
      bVar3 = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_640);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_640,"Failed to wait on otool process for:\n  ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_640,(file->_M_dataplus)._M_p,file->_M_string_length);
      std::__cxx11::stringbuf::str();
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_3d8);
LAB_0055a658:
      if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
        operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_640);
      std::ios_base::~ios_base(local_5d0);
LAB_0055a766:
      bVar3 = false;
    }
    local_1d0._0_8_ = cmBasicUVPipeIStream<char,std::char_traits<char>>::vtable + 0x18;
    local_138[0] = 0xa13698;
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_148);
    local_1d0._0_8_ =
         cmBasicUVIStream<char,std::char_traits<char>>-in-cmBasicUVPipeIStream<char,std::char_traits<char>>
         ::construction_vtable + 0x18;
    local_138[0] = 0xa13718;
    cmBasicUVStreambuf<char,_std::char_traits<char>_>::~cmBasicUVStreambuf
              ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)(local_1d0 + 0x10));
    local_1d0._0_8_ =
         std::istream-in-cmBasicUVPipeIStream<char,std::char_traits<char>>::construction_vtable +
         0x18;
    local_138[0] = 0xa13780;
    local_1d0._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)local_138);
    if (local_688 != (StdioConfiguration)((long)local_690 + 0x18)) {
      operator_delete((void *)local_688,CONCAT71(uStack_677,local_678) + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_640);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_640,"Failed to start otool process for:\n  ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_640,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__cxx11::stringbuf::str();
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_640);
    std::ios_base::~ios_base(local_5d0);
    bVar3 = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_690);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.WorkingDirectory._M_dataplus._M_p != &local_438.WorkingDirectory.field_2) {
    operator_delete(local_438.WorkingDirectory._M_dataplus._M_p,
                    local_438.WorkingDirectory.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_438.Processes);
LAB_0055a200:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_668);
  return bVar3;
LAB_0055a3e3:
  bVar3 = cmsys::RegularExpression::find
                    (&GetFileInfo::loadDylibRegex,(char *)local_688,
                     (RegularExpressionMatch *)local_640);
  if (!bVar3) goto LAB_0055a2a8;
  cVar4 = std::ios::widen((char)*(_func_int **)(local_1d0._0_8_ + -0x18) + cVar5);
  piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_1d0,psVar1,cVar4);
  if (((&piVar8->field_0x20)[(long)piVar8->_vptr_basic_istream[-3]] & 5) == 0) {
    cVar5 = std::ios::widen((char)*(_func_int **)(local_1d0._0_8_ + -0x18) + cVar5);
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1d0,psVar1,cVar5);
    if (((&piVar8->field_0x20)[(long)piVar8->_vptr_basic_istream[-3]] & 5) == 0) {
      memset((RegularExpressionMatch *)local_3d8,0,0x208);
      bVar3 = cmsys::RegularExpression::find
                        (&GetFileInfo::nameRegex,(char *)local_688,
                         (RegularExpressionMatch *)local_3d8);
      if (bVar3) {
        if ((char *)local_3d8._8_8_ == (char *)0x0) {
          local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
          local_6b0._M_string_length = 0;
          local_6b0.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6b0,local_3d8._8_8_,local_2d0);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   local_650._M_allocated_capacity,&local_6b0);
LAB_0055a51b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
          operator_delete(local_6b0._M_dataplus._M_p,
                          CONCAT71(local_6b0.field_2._M_allocated_capacity._1_7_,
                                   local_6b0.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0055a2a8;
      }
      local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6b0,"Invalid output from otool","");
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_6b0);
LAB_0055a74a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0._M_dataplus._M_p == &local_6b0.field_2) goto LAB_0055a766;
      local_3d8._16_8_ =
           CONCAT71(local_6b0.field_2._M_allocated_capacity._1_7_,local_6b0.field_2._M_local_buf[0])
      ;
      _Var9._M_p = local_6b0._M_dataplus._M_p;
      goto LAB_0055a75e;
    }
  }
  local_3d8._0_8_ = local_3d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d8,"Invalid output from otool","");
  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
            (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_3d8);
LAB_0055a6d3:
  _Var9._M_p = (pointer)local_3d8._0_8_;
  if ((undefined1 *)local_3d8._0_8_ == local_3d8 + 0x10) goto LAB_0055a766;
LAB_0055a75e:
  operator_delete(_Var9._M_p,local_3d8._16_8_ + 1);
  goto LAB_0055a766;
}

Assistant:

bool cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo(
  std::string const& file, std::vector<std::string>& libs,
  std::vector<std::string>& rpaths)
{
  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("otool", command)) {
    this->SetError("Could not find otool");
    return false;
  }
  command.emplace_back("-l");
  command.emplace_back(file);

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid() || process.GetStatus(0).SpawnResult != 0) {
    std::ostringstream e;
    e << "Failed to start otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression rpathRegex("^ *cmd LC_RPATH$");
  static const cmsys::RegularExpression loadDylibRegex(
    "^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
  static const cmsys::RegularExpression pathRegex(
    "^ *path (.*) \\(offset [0-9]+\\)$");
  static const cmsys::RegularExpression nameRegex(
    "^ *name (.*) \\(offset [0-9]+\\)$");
  cmUVPipeIStream output(process.GetLoop(), process.OutputStream());
  while (std::getline(output, line)) {
    cmsys::RegularExpressionMatch cmdMatch;
    if (rpathRegex.find(line.c_str(), cmdMatch)) {
      // NOLINTNEXTLINE(misc-redundant-expression)
      if (!std::getline(output, line) || !std::getline(output, line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch pathMatch;
      if (pathRegex.find(line.c_str(), pathMatch)) {
        rpaths.push_back(pathMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    } else if (loadDylibRegex.find(line.c_str(), cmdMatch)) {
      // NOLINTNEXTLINE(misc-redundant-expression)
      if (!std::getline(output, line) || !std::getline(output, line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch nameMatch;
      if (nameRegex.find(line.c_str(), nameMatch)) {
        libs.push_back(nameMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  if (process.GetStatus(0).ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run otool on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}